

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void rbuFossilDeltaFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  void *pvVar6;
  byte *pbVar7;
  char *z;
  byte *pbVar8;
  byte *pbVar9;
  byte bVar10;
  uint uVar11;
  Mem *pMem;
  uint uVar12;
  int iVar13;
  uchar *zStart;
  size_t __n;
  char *__dest;
  uint n;
  int iVar14;
  uint local_64;
  
  iVar2 = sqlite3ValueBytes(*argv,'\x01');
  pvVar6 = sqlite3_value_blob(*argv);
  iVar3 = sqlite3ValueBytes(argv[1],'\x01');
  pbVar7 = (byte *)sqlite3_value_blob(argv[1]);
  uVar4 = 0;
  bVar10 = rbuDeltaGetInt_zValue[*pbVar7 & 0x7f];
  pbVar9 = pbVar7;
  while (-1 < (char)bVar10) {
    uVar4 = uVar4 * 0x40 + (uint)bVar10;
    pbVar8 = pbVar9 + 1;
    pbVar9 = pbVar9 + 1;
    bVar10 = rbuDeltaGetInt_zValue[*pbVar8 & 0x7f];
  }
  n = 0xffffffff;
  if (*pbVar9 == 10) {
    n = uVar4;
  }
  if ((int)n < 0) {
    context->isError = 1;
    pMem = context->pOut;
  }
  else {
    z = (char *)sqlite3_malloc(n + 1);
    if (z == (char *)0x0) {
      sqlite3_result_error_nomem(context);
      return;
    }
    bVar10 = rbuDeltaGetInt_zValue[*pbVar7 & 0x7f];
    pbVar9 = pbVar7;
    if ((char)bVar10 < '\0') {
      uVar4 = 0;
    }
    else {
      uVar4 = 0;
      do {
        uVar4 = uVar4 * 0x40 + (uint)bVar10;
        pbVar8 = pbVar9 + 1;
        pbVar9 = pbVar9 + 1;
        bVar10 = rbuDeltaGetInt_zValue[*pbVar8 & 0x7f];
      } while (-1 < (char)bVar10);
    }
    uVar12 = 0xffffffff;
    if (*pbVar9 == 10) {
      pbVar8 = pbVar9 + 1;
      iVar3 = iVar3 + ((int)pbVar7 - (int)pbVar9) + -1;
      local_64 = 0;
      __dest = z;
      do {
        if ((*pbVar8 == 0) || (iVar3 < 1)) {
          uVar12 = 0xffffffff;
          break;
        }
        __n = 0;
        bVar10 = rbuDeltaGetInt_zValue[*pbVar8 & 0x7f];
        pbVar9 = pbVar8;
        while (iVar13 = (int)__n, -1 < (char)bVar10) {
          __n = (size_t)(iVar13 * 0x40 + (uint)bVar10);
          pbVar7 = pbVar9 + 1;
          pbVar9 = pbVar9 + 1;
          bVar10 = rbuDeltaGetInt_zValue[*pbVar7 & 0x7f];
        }
        iVar14 = iVar3 + ((int)pbVar8 - (int)pbVar9);
        bVar10 = *pbVar9;
        if (bVar10 == 0x3a) {
          pbVar9 = pbVar9 + 1;
          iVar3 = iVar14 + -1;
          uVar11 = local_64 + iVar13;
          if ((uVar4 < uVar11) || (iVar14 <= iVar13)) goto LAB_001d2af9;
          memcpy(__dest,pbVar9,__n);
          pbVar9 = pbVar9 + __n;
          iVar3 = iVar3 - iVar13;
LAB_001d2add:
          local_64 = local_64 + iVar13;
          __dest = __dest + __n;
          bVar1 = true;
          pbVar8 = pbVar9;
        }
        else if (bVar10 == 0x3b) {
          pbVar8 = pbVar9 + 1;
          iVar3 = iVar14 + -1;
          *__dest = '\0';
          uVar12 = 0xffffffff;
          if (local_64 == uVar4) {
            uVar12 = local_64;
          }
          bVar1 = false;
        }
        else {
          iVar3 = iVar14;
          uVar11 = local_64;
          if (bVar10 == 0x40) {
            pbVar7 = pbVar9 + 1;
            uVar5 = 0;
            bVar10 = rbuDeltaGetInt_zValue[pbVar9[1] & 0x7f];
            pbVar9 = pbVar7;
            while (-1 < (char)bVar10) {
              uVar5 = uVar5 * 0x40 + (uint)bVar10;
              pbVar8 = pbVar9 + 1;
              pbVar9 = pbVar9 + 1;
              bVar10 = rbuDeltaGetInt_zValue[*pbVar8 & 0x7f];
            }
            iVar3 = ((int)pbVar7 - (int)pbVar9) + iVar14 + -1;
            if ((iVar3 < 1) || (*pbVar9 == 0x2c)) {
              pbVar9 = pbVar9 + 1;
              iVar3 = iVar3 + -1;
              uVar11 = local_64 + iVar13;
              if ((uVar11 <= uVar4) && ((int)(uVar5 + iVar13) <= iVar2)) {
                memcpy(__dest,(void *)((ulong)uVar5 + (long)pvVar6),__n);
                goto LAB_001d2add;
              }
            }
          }
LAB_001d2af9:
          bVar1 = false;
          uVar12 = 0xffffffff;
          pbVar8 = pbVar9;
          local_64 = uVar11;
        }
      } while (bVar1);
    }
    if (uVar12 == n) {
      setResultStrOrError(context,z,n,'\0',sqlite3_free);
      return;
    }
    sqlite3_free(z);
    context->isError = 1;
    pMem = context->pOut;
  }
  sqlite3VdbeMemSetStr
            (pMem,"corrupt fossil delta",-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
  return;
}

Assistant:

static void rbuFossilDeltaFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const char *aDelta;
  int nDelta;
  const char *aOrig;
  int nOrig;

  int nOut;
  int nOut2;
  char *aOut;

  assert( argc==2 );

  nOrig = sqlite3_value_bytes(argv[0]);
  aOrig = (const char*)sqlite3_value_blob(argv[0]);
  nDelta = sqlite3_value_bytes(argv[1]);
  aDelta = (const char*)sqlite3_value_blob(argv[1]);

  /* Figure out the size of the output */
  nOut = rbuDeltaOutputSize(aDelta, nDelta);
  if( nOut<0 ){
    sqlite3_result_error(context, "corrupt fossil delta", -1);
    return;
  }

  aOut = sqlite3_malloc(nOut+1);
  if( aOut==0 ){
    sqlite3_result_error_nomem(context);
  }else{
    nOut2 = rbuDeltaApply(aOrig, nOrig, aDelta, nDelta, aOut);
    if( nOut2!=nOut ){
      sqlite3_free(aOut);
      sqlite3_result_error(context, "corrupt fossil delta", -1);
    }else{
      sqlite3_result_blob(context, aOut, nOut, sqlite3_free);
    }
  }
}